

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::ModExpr::ModExpr(ModExpr *this,Lexer *lexer,Position *pos,Token *tokId,Exprs *exprs)

{
  Exprs *exprs_local;
  Token *tokId_local;
  Position *pos_local;
  Lexer *lexer_local;
  ModExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_MOD,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ModExpr_0017f8d0;
  this->tokId = tokId;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->exprs,exprs);
  if (this->tokId != (Token *)0x0) {
    _setParents<pfederc::Expr>(&this->exprs,&this->super_Expr);
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x240,
                "pfederc::ModExpr::ModExpr(const Lexer &, const Position &, const Token *, Exprs &&)"
               );
}

Assistant:

ModExpr::ModExpr(const Lexer &lexer, const Position &pos,
    const Token *tokId, Exprs &&exprs) noexcept
    : Expr(lexer, ExprType::EXPR_MOD, pos), tokId{tokId}, exprs(std::move(exprs)) {
  assert(this->tokId);

  _setParents(this->exprs, this);
}